

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

FlagBase * __thiscall args::Command::Match(Command *this,EitherFlag *flag)

{
  Command *pCVar1;
  pointer ppBVar2;
  Base *pBVar3;
  Subparser *pSVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppBVar6;
  FlagBase *pFVar7;
  bool bVar8;
  
  pCVar1 = this->selectedCommand;
  if (pCVar1 == (Command *)0x0) {
    pSVar4 = this->subparser;
    if (pSVar4 != (Subparser *)0x0) {
      iVar5 = (*(pSVar4->super_Group).super_Base._vptr_Base[7])(pSVar4,flag);
      return (FlagBase *)CONCAT44(extraout_var_01,iVar5);
    }
    iVar5 = (*(this->super_Group).super_Base._vptr_Base[2])(this);
    if ((char)iVar5 != '\0') {
      ppBVar6 = (this->super_Group).children.
                super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppBVar2 = (this->super_Group).children.
                super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppBVar6 != ppBVar2) {
        do {
          iVar5 = (*(*ppBVar6)->_vptr_Base[7])(*ppBVar6,flag);
          if ((FlagBase *)CONCAT44(extraout_var_02,iVar5) != (FlagBase *)0x0) {
            return (FlagBase *)CONCAT44(extraout_var_02,iVar5);
          }
          ppBVar6 = ppBVar6 + 1;
        } while (ppBVar6 != ppBVar2);
        return (FlagBase *)0x0;
      }
    }
  }
  else {
    iVar5 = (*(pCVar1->super_Group).super_Base._vptr_Base[7])(pCVar1,flag);
    if ((FlagBase *)CONCAT44(extraout_var,iVar5) != (FlagBase *)0x0) {
      return (FlagBase *)CONCAT44(extraout_var,iVar5);
    }
    ppBVar2 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pFVar7 = (FlagBase *)0x0;
    for (ppBVar6 = (this->super_Group).children.
                   super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppBVar6 != ppBVar2; ppBVar6 = ppBVar6 + 1) {
      pBVar3 = *ppBVar6;
      bVar8 = true;
      if ((pBVar3->options & Global) != None) {
        iVar5 = (*pBVar3->_vptr_Base[7])(pBVar3,flag);
        bVar8 = (FlagBase *)CONCAT44(extraout_var_00,iVar5) == (FlagBase *)0x0;
        if (!bVar8) {
          pFVar7 = (FlagBase *)CONCAT44(extraout_var_00,iVar5);
        }
      }
      if (!bVar8) {
        return pFVar7;
      }
    }
  }
  return (FlagBase *)0x0;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &flag) override
            {
                if (selectedCommand != nullptr)
                {
                    if (auto *res = selectedCommand->Match(flag))
                    {
                        return res;
                    }

                    for (auto *child: Children())
                    {
                        if ((child->GetOptions() & Options::Global) != Options::None)
                        {
                            if (auto *res = child->Match(flag))
                            {
                                return res;
                            }
                        }
                    }

                    return nullptr;
                }

                if (subparser != nullptr)
                {
                    return subparser->Match(flag);
                }

                return Matched() ? Group::Match(flag) : nullptr;
            }